

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

char * Prs_ManWriteRange(Prs_Ntk_t *p,int RangeId,int fSlice)

{
  Vec_Str_t *pVVar1;
  uint local_30;
  uint local_2c;
  int Right;
  int Left;
  int fSlice_local;
  int RangeId_local;
  Prs_Ntk_t *p_local;
  
  if (RangeId == 0) {
    local_2c = 0;
    local_30 = 0;
  }
  else {
    local_2c = Hash_IntObjData0(p->vHash,RangeId);
    local_30 = Hash_IntObjData1(p->vHash,RangeId);
  }
  if ((local_2c == local_30) && (fSlice != 0)) {
    pVVar1 = Abc_NamBuffer(p->pStrs);
    p_local = (Prs_Ntk_t *)Vec_StrPrintF(pVVar1,"[%d]",(ulong)local_30);
  }
  else {
    pVVar1 = Abc_NamBuffer(p->pStrs);
    p_local = (Prs_Ntk_t *)Vec_StrPrintF(pVVar1,"[%d:%d]",(ulong)local_2c,(ulong)local_30);
  }
  return (char *)p_local;
}

Assistant:

static inline char * Prs_ManWriteRange( Prs_Ntk_t * p, int RangeId, int fSlice )
{
    int Left  = RangeId ? Hash_IntObjData0( p->vHash, RangeId ) : 0;
    int Right = RangeId ? Hash_IntObjData1( p->vHash, RangeId ) : 0;
    if ( Left == Right && fSlice )
        return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "[%d]", Right );
    else
        return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "[%d:%d]", Left, Right );
}